

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff.cpp
# Opt level: O3

void __thiscall
Diff_BuildWriteIndexValues_Test::~Diff_BuildWriteIndexValues_Test
          (Diff_BuildWriteIndexValues_Test *this)

{
  (this->super_Diff).super_Test._vptr_Test = (_func_int **)&PTR__Diff_0026c070;
  pstore::database::~database(&(this->super_Diff).db_);
  in_memory_store::~in_memory_store(&(this->super_Diff).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x158);
  return;
}

Assistant:

TEST_F (Diff, BuildWriteIndexValues) {
    using ::testing::ContainerEq;
    using ::testing::WhenSortedBy;

    using value_type = std::pair<std::string, pstore::extent<char>>;
    value_type v1, v2;

    {
        std::string const k1 = "key1";
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        v1 = std::make_pair (k1, this->add (t1, k1, "first value"));
        t1.commit ();
    }
    {
        std::string const k2 = "key2";
        transaction_type t2 = begin (db_, lock_guard{mutex_});
        v2 = std::make_pair (k2, this->add (t2, k2, "second value"));
        t2.commit ();
    }
    ASSERT_EQ (2U, db_.get_current_revision ());

    {
        // Check the diff between r2 and r0.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 0U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, ::testing::UnorderedElementsAre (v1, v2));
    }

    {
        // Check the diff between r2 and r1.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 1U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, ::testing::UnorderedElementsAre (v2));
    }

    {
        // Check the diff between r2 and r2.
        std::vector<pstore::address> actual;
        pstore::diff (db_, *pstore::index::get_index<pstore::trailer::indices::write> (db_), 2U,
                      std::back_inserter (actual));
        EXPECT_EQ (actual.size (), 0U);
    }
}